

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void util_tests::TestOtherProcess(path *dirname,path *lockname,int fd)

{
  ssize_t sVar1;
  int in_EDX;
  anon_class_16_2_f325ac15 *in_RDI;
  int rv;
  char ch;
  anon_enum_8 local_15;
  int local_14;
  
  local_14 = in_EDX;
  while( true ) {
    while( true ) {
      sVar1 = ::read(local_14,&local_15,1);
      if ((int)sVar1 != 1) {
        __assert_fail("rv == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ,0x473,"void util_tests::TestOtherProcess(fs::path, fs::path, int)");
      }
      if (local_15 != 0x4c) break;
      local_15 = TestOtherProcess::anon_class_16_2_f325ac15::operator()(in_RDI);
      sVar1 = ::write(local_14,&local_15,1);
      if ((int)sVar1 != 1) {
        __assert_fail("rv == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                      ,0x47f,"void util_tests::TestOtherProcess(fs::path, fs::path, int)");
      }
    }
    if (local_15 != 0x55) break;
    ReleaseDirectoryLocks();
    local_15 = ResUnlockSuccess;
    sVar1 = ::write(local_14,&local_15,1);
    if ((int)sVar1 != 1) {
      __assert_fail("rv == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                    ,0x485,"void util_tests::TestOtherProcess(fs::path, fs::path, int)");
    }
  }
  if (local_15 == 0x58) {
    close(local_14);
    exit(0);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
                ,0x48b,"void util_tests::TestOtherProcess(fs::path, fs::path, int)");
}

Assistant:

[[noreturn]] static void TestOtherProcess(fs::path dirname, fs::path lockname, int fd)
{
    char ch;
    while (true) {
        int rv = read(fd, &ch, 1); // Wait for command
        assert(rv == 1);
        switch (ch) {
        case LockCommand:
            ch = [&] {
                switch (util::LockDirectory(dirname, lockname)) {
                case util::LockResult::Success: return ResSuccess;
                case util::LockResult::ErrorWrite: return ResErrorWrite;
                case util::LockResult::ErrorLock: return ResErrorLock;
                } // no default case, so the compiler can warn about missing cases
                assert(false);
            }();
            rv = write(fd, &ch, 1);
            assert(rv == 1);
            break;
        case UnlockCommand:
            ReleaseDirectoryLocks();
            ch = ResUnlockSuccess; // Always succeeds
            rv = write(fd, &ch, 1);
            assert(rv == 1);
            break;
        case ExitCommand:
            close(fd);
            exit(0);
        default:
            assert(0);
        }
    }
}